

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O0

Bbr_ImageTree2_t *
Bbr_bddImageStart2(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,DdNode **pbVars
                  ,int fVerbose)

{
  Bbr_ImageTree2_t *pTree_00;
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int local_5c;
  int i;
  DdNode *bTemp;
  DdNode *bCubeNot;
  DdNode *bCubeAll;
  Bbr_ImageTree2_t *pTree;
  DdNode **pbVars_local;
  int nVars_local;
  DdNode **pbParts_local;
  int nParts_local;
  DdNode *bCare_local;
  DdManager *dd_local;
  
  pTree_00 = (Bbr_ImageTree2_t *)malloc(0x20);
  pTree_00->dd = dd;
  pTree_00->bImage = (DdNode *)0x0;
  pDVar1 = Bbr_bddComputeCube(dd,dd->vars,dd->size);
  Cudd_Ref(pDVar1);
  pDVar2 = Bbr_bddComputeCube(dd,pbVars,nVars);
  Cudd_Ref(pDVar2);
  pDVar3 = Cudd_bddExistAbstract(dd,pDVar1,pDVar2);
  pTree_00->bCube = pDVar3;
  Cudd_Ref(pTree_00->bCube);
  Cudd_RecursiveDeref(dd,pDVar1);
  Cudd_RecursiveDeref(dd,pDVar2);
  pTree_00->bRel = dd->one;
  Cudd_Ref(pTree_00->bRel);
  for (local_5c = 0; local_5c < nParts; local_5c = local_5c + 1) {
    pDVar1 = pTree_00->bRel;
    pDVar2 = Cudd_bddAnd(dd,pDVar1,pbParts[local_5c]);
    pTree_00->bRel = pDVar2;
    Cudd_Ref(pTree_00->bRel);
    Cudd_RecursiveDeref(dd,pDVar1);
  }
  Bbr_bddImageCompute2(pTree_00,bCare);
  return pTree_00;
}

Assistant:

Bbr_ImageTree2_t * Bbr_bddImageStart2( 
    DdManager * dd, DdNode * bCare,
    int nParts, DdNode ** pbParts,
    int nVars, DdNode ** pbVars, int fVerbose )
{
    Bbr_ImageTree2_t * pTree;
    DdNode * bCubeAll, * bCubeNot, * bTemp;
    int i;

    pTree = ABC_ALLOC( Bbr_ImageTree2_t, 1 );
    pTree->dd = dd;
    pTree->bImage = NULL;

    bCubeAll = Bbr_bddComputeCube( dd, dd->vars, dd->size );      Cudd_Ref( bCubeAll );
    bCubeNot = Bbr_bddComputeCube( dd, pbVars,   nVars );         Cudd_Ref( bCubeNot );
    pTree->bCube = Cudd_bddExistAbstract( dd, bCubeAll, bCubeNot ); Cudd_Ref( pTree->bCube );
    Cudd_RecursiveDeref( dd, bCubeAll );
    Cudd_RecursiveDeref( dd, bCubeNot );

    // derive the monolithic relation
    pTree->bRel = b1;   Cudd_Ref( pTree->bRel );
    for ( i = 0; i < nParts; i++ )
    {
        pTree->bRel = Cudd_bddAnd( dd, bTemp = pTree->bRel, pbParts[i] ); Cudd_Ref( pTree->bRel );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Bbr_bddImageCompute2( pTree, bCare );
    return pTree;
}